

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

optional<spv::Capability>
spvtools::opt::Handler_OpImageRead_StorageImageReadWithoutFormat(Instruction *instruction)

{
  IRContext *this;
  DefUseManager *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  _Optional_payload_base<spv::Capability> _Var4;
  uint uVar5;
  
  if (instruction->opcode_ == OpImageRead) {
    this = instruction->context_;
    if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this);
    }
    this_00 = (this->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar1 = (instruction->has_result_id_ & 1) + 1;
    if (instruction->has_type_id_ == false) {
      uVar1 = (uint)instruction->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(instruction,uVar1);
    pIVar3 = analysis::DefUseManager::GetDef(this_00,uVar1);
    uVar1 = 0;
    if (pIVar3->has_type_id_ == true) {
      uVar1 = Instruction::GetSingleWordOperand(pIVar3,0);
    }
    pIVar3 = analysis::DefUseManager::GetDef(this_00,uVar1);
    uVar5 = (pIVar3->has_result_id_ & 1) + 1;
    if (pIVar3->has_type_id_ == false) {
      uVar5 = (uint)pIVar3->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(pIVar3,uVar5 + 1);
    uVar5 = (pIVar3->has_result_id_ & 1) + 1;
    if (pIVar3->has_type_id_ == false) {
      uVar5 = (uint)pIVar3->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar5 + 6);
    _Var4._M_payload = (_Storage<spv::Capability,_true>)0x37;
    _Var4._M_engaged = false;
    _Var4._5_3_ = 0;
    if (uVar1 != 6) {
      _Var4 = (_Optional_payload_base<spv::Capability>)((ulong)(uVar2 == 0) << 0x20 | 0x37);
    }
    return (optional<spv::Capability>)_Var4;
  }
  __assert_fail("instruction->opcode() == spv::Op::OpImageRead && \"This handler only support OpImageRead opcodes.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0x147,
                "std::optional<spv::Capability> spvtools::opt::Handler_OpImageRead_StorageImageReadWithoutFormat(const Instruction *)"
               );
}

Assistant:

static std::optional<spv::Capability>
Handler_OpImageRead_StorageImageReadWithoutFormat(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpImageRead &&
         "This handler only support OpImageRead opcodes.");
  const auto* def_use_mgr = instruction->context()->get_def_use_mgr();

  const uint32_t image_index =
      instruction->GetSingleWordInOperand(kOpImageReadImageIndex);
  const uint32_t type_index = def_use_mgr->GetDef(image_index)->type_id();
  const Instruction* type = def_use_mgr->GetDef(type_index);
  const uint32_t dim = type->GetSingleWordInOperand(kOpTypeImageDimIndex);
  const uint32_t format = type->GetSingleWordInOperand(kOpTypeImageFormatIndex);

  const bool is_unknown = spv::ImageFormat(format) == spv::ImageFormat::Unknown;
  const bool requires_capability_for_unknown =
      spv::Dim(dim) != spv::Dim::SubpassData;
  return is_unknown && requires_capability_for_unknown
             ? std::optional(spv::Capability::StorageImageReadWithoutFormat)
             : std::nullopt;
}